

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_group_t bsc_group_create_partition(uint color)

{
  bsp_pid_t bVar1;
  bsp_pid_t bVar2;
  void *addr;
  group_t *g_00;
  group_t *g;
  uint *all_colors;
  int local_20;
  bsp_pid_t rof;
  bsp_pid_t n_members;
  bsp_pid_t s;
  bsp_pid_t P;
  bsp_pid_t j;
  bsp_pid_t i;
  uint color_local;
  
  j = color;
  bVar1 = bsp_nprocs();
  bVar2 = bsp_pid();
  local_20 = 0;
  all_colors._4_4_ = 0;
  addr = calloc((long)bVar1,4);
  g_00 = (group_t *)calloc(1,0x20);
  if ((addr == (void *)0x0) || (g_00 == (group_t *)0x0)) {
    bsp_abort("bsc_group_create_partition: Insufficient memory");
  }
  bsp_push_reg(addr,bVar1 << 2);
  bsp_sync();
  for (P = 0; P < bVar1; P = P + 1) {
    bsp_put(P,&j,addr,bVar2 << 2,4);
  }
  bsp_sync();
  for (P = 0; P < bVar1; P = P + 1) {
    if (*(int *)((long)addr + (long)P * 4) == j) {
      if (P == bVar2) {
        all_colors._4_4_ = local_20;
      }
      local_20 = local_20 + 1;
    }
  }
  group_create(g_00,local_20);
  s = 0;
  for (P = 0; P < bVar1; P = P + 1) {
    if (*(int *)((long)addr + (long)P * 4) == j) {
      g_00->lid[P] = s;
      g_00->rof[s] = all_colors._4_4_;
      g_00->gid[s] = P;
      s = s + 1;
    }
    else {
      g_00->lid[P] = -1;
    }
  }
  bsp_pop_reg(addr);
  bsp_sync();
  free(addr);
  return g_00;
}

Assistant:

bsc_group_t bsc_group_create_partition( unsigned color )
{
    bsp_pid_t i, j, P = bsp_nprocs(), s = bsp_pid();
    bsp_pid_t n_members = 0;
    bsp_pid_t rof = 0;
    unsigned * all_colors = calloc( P, sizeof(all_colors[0]) );
    group_t * g = calloc( 1, sizeof(*g) );
    if (!all_colors || !g)
        bsp_abort("bsc_group_create_partition: Insufficient memory");
    bsp_push_reg( all_colors, P * sizeof(all_colors[0]) );
    bsp_sync();

    /* all-gather the colors */
    for ( i = 0 ; i < P; ++i ) {
        bsp_put( i, &color, all_colors, sizeof(all_colors[0])*s,
                sizeof(all_colors[0]) );
    }
    bsp_sync();

    /* count number of members */
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            if (i == s ) rof = n_members;
            n_members += 1;
        }

    group_create( g, n_members );
    j = 0;
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            g->lid[ i ] = j;
            g->rof[ j ] = rof;
            g->gid[ j ] = i;
            j++;
        }
        else {
            g->lid[i] = -1;
        }

    bsp_pop_reg(all_colors);
    bsp_sync();
    free(all_colors);

    return g;
}